

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v9::detail::assert_fail(char *file,int line,char *message)

{
  undefined8 in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  
  fprintf(_stderr,"%s:%d: assertion failed: %s",in_RDI,(ulong)in_ESI,in_RDX);
  std::terminate();
}

Assistant:

FMT_FUNC void assert_fail(const char* file, int line, const char* message) {
  // Use unchecked std::fprintf to avoid triggering another assertion when
  // writing to stderr fails
  std::fprintf(stderr, "%s:%d: assertion failed: %s", file, line, message);
  // Chosen instead of std::abort to satisfy Clang in CUDA mode during device
  // code pass.
  std::terminate();
}